

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int seek_file(WFile *f,uint64_t offset,int whence)

{
  __off_t _Var1;
  int local_28;
  int lseek_whence;
  int whence_local;
  uint64_t offset_local;
  WFile *f_local;
  
  if (whence == 0) {
    local_28 = 0;
  }
  else if (whence == 1) {
    local_28 = 1;
  }
  else {
    if (whence != 2) {
      return -1;
    }
    local_28 = 2;
  }
  _Var1 = lseek(f->fd,offset,local_28);
  f_local._4_4_ = -1;
  if (-1 < _Var1) {
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

int seek_file(WFile *f, uint64_t offset, int whence)
{
    int lseek_whence;

    switch (whence) {
    case FROM_START:
        lseek_whence = SEEK_SET;
        break;
    case FROM_CURRENT:
        lseek_whence = SEEK_CUR;
        break;
    case FROM_END:
        lseek_whence = SEEK_END;
        break;
    default:
        return -1;
    }

    return lseek(f->fd, offset, lseek_whence) >= 0 ? 0 : -1;
}